

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O3

Kit_Graph_t * Kit_GraphCreateConst0(void)

{
  Kit_Graph_t *pKVar1;
  
  pKVar1 = (Kit_Graph_t *)calloc(1,0x20);
  pKVar1->fConst = 1;
  pKVar1->eRoot = (Kit_Edge_t)0x1;
  return pKVar1;
}

Assistant:

Kit_Graph_t * Kit_GraphCreateConst0()   
{
    Kit_Graph_t * pGraph;
    pGraph = ABC_ALLOC( Kit_Graph_t, 1 );
    memset( pGraph, 0, sizeof(Kit_Graph_t) );
    pGraph->fConst = 1;
    pGraph->eRoot.fCompl = 1;
    return pGraph;
}